

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O0

bool __thiscall crnlib::dds_comp::convert_to_dxt(dds_comp *this,crn_comp_params *params)

{
  bool bVar1;
  qdxt_state *pqVar2;
  bool hierarchical;
  crn_comp_params *params_local;
  dds_comp *this_local;
  
  if ((params->m_quality_level == 0xff) || (params->m_format == cCRNFmtDXT3)) {
    mipmapped_texture::operator=(&this->m_packed_tex,&this->m_src_tex);
    bVar1 = mipmapped_texture::convert
                      (&this->m_packed_tex,this->m_pixel_fmt,false,&this->m_pack_params);
    if (!bVar1) {
      return false;
    }
  }
  else {
    bVar1 = (params->m_flags & 2) != 0;
    (this->m_q1_params).m_quality_level = params->m_quality_level;
    (this->m_q1_params).m_hierarchical = bVar1;
    (this->m_q5_params).m_quality_level = params->m_quality_level;
    (this->m_q5_params).m_hierarchical = bVar1;
    if (this->m_pQDXT_state == (qdxt_state *)0x0) {
      pqVar2 = crnlib_new<crnlib::mipmapped_texture::qdxt_state,crnlib::task_pool>
                         ((crnlib *)&this->m_task_pool,(task_pool *)params);
      this->m_pQDXT_state = pqVar2;
      if (params->m_pProgress_func != (crn_progress_callback_func)0x0) {
        (this->m_q1_params).m_pProgress_func = progress_callback_func_phase_0;
        (this->m_q1_params).m_pProgress_data = params;
        (this->m_q5_params).m_pProgress_func = progress_callback_func_phase_0;
        (this->m_q5_params).m_pProgress_data = params;
      }
      bVar1 = mipmapped_texture::qdxt_pack_init
                        (&this->m_src_tex,this->m_pQDXT_state,&this->m_packed_tex,&this->m_q1_params
                         ,&this->m_q5_params,this->m_pixel_fmt,false);
      if (!bVar1) {
        return false;
      }
      if (params->m_pProgress_func != (crn_progress_callback_func)0x0) {
        (this->m_q1_params).m_pProgress_func = progress_callback_func_phase_1;
        (this->m_q5_params).m_pProgress_func = progress_callback_func_phase_1;
      }
    }
    else if (params->m_pProgress_func != (crn_progress_callback_func)0x0) {
      (this->m_q1_params).m_pProgress_func = progress_callback_func;
      (this->m_q1_params).m_pProgress_data = params;
      (this->m_q5_params).m_pProgress_func = progress_callback_func;
      (this->m_q5_params).m_pProgress_data = params;
    }
    bVar1 = mipmapped_texture::qdxt_pack
                      (&this->m_src_tex,this->m_pQDXT_state,&this->m_packed_tex,&this->m_q1_params,
                       &this->m_q5_params);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool dds_comp::convert_to_dxt(const crn_comp_params& params)
    {
        if ((params.m_quality_level == cCRNMaxQualityLevel) || (params.m_format == cCRNFmtDXT3))
        {
            m_packed_tex = m_src_tex;
            if (!m_packed_tex.convert(m_pixel_fmt, false, m_pack_params))
            {
                return false;
            }
        }
        else
        {
            const bool hierarchical = (params.m_flags & cCRNCompFlagHierarchical) != 0;

            m_q1_params.m_quality_level = params.m_quality_level;
            m_q1_params.m_hierarchical = hierarchical;

            m_q5_params.m_quality_level = params.m_quality_level;
            m_q5_params.m_hierarchical = hierarchical;

            if (!m_pQDXT_state)
            {
                m_pQDXT_state = crnlib_new<mipmapped_texture::qdxt_state>(m_task_pool);

                if (params.m_pProgress_func)
                {
                    m_q1_params.m_pProgress_func = progress_callback_func_phase_0;
                    m_q1_params.m_pProgress_data = (void*)&params;
                    m_q5_params.m_pProgress_func = progress_callback_func_phase_0;
                    m_q5_params.m_pProgress_data = (void*)&params;
                }

                if (!m_src_tex.qdxt_pack_init(*m_pQDXT_state, m_packed_tex, m_q1_params, m_q5_params, m_pixel_fmt, false))
                {
                    return false;
                }

                if (params.m_pProgress_func)
                {
                    m_q1_params.m_pProgress_func = progress_callback_func_phase_1;
                    m_q5_params.m_pProgress_func = progress_callback_func_phase_1;
                }
            }
            else
            {
                if (params.m_pProgress_func)
                {
                    m_q1_params.m_pProgress_func = progress_callback_func;
                    m_q1_params.m_pProgress_data = (void*)&params;
                    m_q5_params.m_pProgress_func = progress_callback_func;
                    m_q5_params.m_pProgress_data = (void*)&params;
                }
            }

            if (!m_src_tex.qdxt_pack(*m_pQDXT_state, m_packed_tex, m_q1_params, m_q5_params))
            {
                return false;
            }
        }

        return true;
    }